

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O0

size_t __thiscall geometrycentral::surface::SurfaceMesh::nConnectedComponents(SurfaceMesh *this)

{
  Vertex e_00;
  Vertex e_01;
  bool bVar1;
  DisjointSets *this_00;
  size_t sVar2;
  MeshData<geometrycentral::surface::Vertex,_unsigned_long> *this_01;
  SurfaceMesh *in_RDI;
  pair<std::__detail::_Node_iterator<unsigned_long,_true,_false>,_bool> pVar3;
  size_t i;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  distinctComponents;
  Edge e;
  RangeIteratorBase<geometrycentral::surface::EdgeRangeF> __end2;
  RangeIteratorBase<geometrycentral::surface::EdgeRangeF> __begin2;
  EdgeSet *__range2;
  DisjointSets dj;
  VertexData<size_t> vertInd;
  RangeIteratorBase<geometrycentral::surface::EdgeRangeF> *in_stack_fffffffffffffda8;
  SurfaceMesh *in_stack_fffffffffffffdb0;
  undefined7 in_stack_fffffffffffffdb8;
  undefined1 in_stack_fffffffffffffdbf;
  _Node_iterator_base<unsigned_long,_false> in_stack_fffffffffffffdc0;
  ParentMeshT *in_stack_fffffffffffffdc8;
  size_t in_stack_fffffffffffffdd0;
  ulong uVar4;
  size_t in_stack_fffffffffffffdd8;
  size_t in_stack_fffffffffffffe08;
  DisjointSets *in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe78;
  undefined7 in_stack_fffffffffffffe79;
  ulong local_178;
  undefined1 local_a8 [24];
  undefined1 *local_90;
  
  getVertexIndices((SurfaceMesh *)CONCAT71(in_stack_fffffffffffffe79,in_stack_fffffffffffffe78));
  nVertices(in_RDI);
  DisjointSets::DisjointSets(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  edges(in_stack_fffffffffffffdb0);
  local_90 = local_a8;
  RangeSetBase<geometrycentral::surface::EdgeRangeF>::begin
            ((RangeSetBase<geometrycentral::surface::EdgeRangeF> *)in_stack_fffffffffffffdb0);
  RangeSetBase<geometrycentral::surface::EdgeRangeF>::end
            ((RangeSetBase<geometrycentral::surface::EdgeRangeF> *)in_stack_fffffffffffffdb0);
  while( true ) {
    bVar1 = RangeIteratorBase<geometrycentral::surface::EdgeRangeF>::operator!=
                      ((RangeIteratorBase<geometrycentral::surface::EdgeRangeF> *)
                       in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    if (!bVar1) break;
    RangeIteratorBase<geometrycentral::surface::EdgeRangeF>::operator*
              ((RangeIteratorBase<geometrycentral::surface::EdgeRangeF> *)0x1c8f2c);
    Edge::halfedge((Edge *)in_stack_fffffffffffffdb0);
    Halfedge::vertex((Halfedge *)in_stack_fffffffffffffdb0);
    e_00.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind
         = in_stack_fffffffffffffdd0;
    e_00.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh
         = in_stack_fffffffffffffdc8;
    MeshData<geometrycentral::surface::Vertex,_unsigned_long>::operator[]
              ((MeshData<geometrycentral::surface::Vertex,_unsigned_long> *)
               in_stack_fffffffffffffdc0._M_cur,e_00);
    Edge::halfedge((Edge *)in_stack_fffffffffffffdb0);
    Halfedge::twin((Halfedge *)in_stack_fffffffffffffdb0);
    Halfedge::vertex((Halfedge *)in_stack_fffffffffffffdb0);
    e_01.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind
         = in_stack_fffffffffffffdd0;
    e_01.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh
         = in_stack_fffffffffffffdc8;
    this_00 = (DisjointSets *)
              MeshData<geometrycentral::surface::Vertex,_unsigned_long>::operator[]
                        ((MeshData<geometrycentral::surface::Vertex,_unsigned_long> *)
                         in_stack_fffffffffffffdc0._M_cur,e_01);
    DisjointSets::merge(this_00,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    RangeIteratorBase<geometrycentral::surface::EdgeRangeF>::operator++
              ((RangeIteratorBase<geometrycentral::surface::EdgeRangeF> *)in_stack_fffffffffffffdb0)
    ;
  }
  ::std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)0x1c913b);
  local_178 = 0;
  while( true ) {
    uVar4 = local_178;
    sVar2 = nVertices(in_RDI);
    if (sVar2 <= uVar4) break;
    DisjointSets::find((DisjointSets *)in_stack_fffffffffffffdc0._M_cur,
                       CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
    pVar3 = ::std::
            unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
            ::insert((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                      *)in_stack_fffffffffffffdc0._M_cur,
                     (value_type *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
    in_stack_fffffffffffffdc0._M_cur =
         (__node_type *)pVar3.first.super__Node_iterator_base<unsigned_long,_false>._M_cur;
    in_stack_fffffffffffffdbf = pVar3.second;
    local_178 = local_178 + 1;
  }
  this_01 = (MeshData<geometrycentral::surface::Vertex,_unsigned_long> *)
            ::std::
            unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
            ::size((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)0x1c9225);
  ::std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)0x1c9237);
  DisjointSets::~DisjointSets((DisjointSets *)this_01);
  MeshData<geometrycentral::surface::Vertex,_unsigned_long>::~MeshData(this_01);
  return (size_t)this_01;
}

Assistant:

size_t SurfaceMesh::nConnectedComponents() {
  VertexData<size_t> vertInd = getVertexIndices();
  DisjointSets dj(nVertices());
  for (Edge e : edges()) {
    dj.merge(vertInd[e.halfedge().vertex()], vertInd[e.halfedge().twin().vertex()]);
  }
  std::unordered_set<size_t> distinctComponents;
  for (size_t i = 0; i < nVertices(); i++) {
    distinctComponents.insert(dj.find(i));
  }
  return distinctComponents.size();
}